

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceMappingBase.cpp
# Opt level: O2

void __thiscall
Diligent::ResourceMappingImpl::RemoveResourceByName
          (ResourceMappingImpl *this,Char *Name,Uint32 ArrayIndex)

{
  ResMappingHashKey local_40;
  
  if (*Name != '\0') {
    Threading::SpinLock::lock(&this->m_Lock);
    ResMappingHashKey::ResMappingHashKey(&local_40,Name,false,ArrayIndex);
    std::
    _Hashtable<Diligent::ResourceMappingImpl::ResMappingHashKey,_std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::STDAllocator<std::pair<const_Diligent::ResourceMappingImpl::ResMappingHashKey,_Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>,_Diligent::IMemoryAllocator>,_std::__detail::_Select1st,_std::equal_to<Diligent::ResourceMappingImpl::ResMappingHashKey>,_Diligent::HashMapStringKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(&(this->m_HashTable)._M_h,&local_40);
    HashMapStringKey::Clear(&local_40.super_HashMapStringKey);
    Threading::SpinLock::unlock(&this->m_Lock);
  }
  return;
}

Assistant:

void ResourceMappingImpl::RemoveResourceByName(const Char* Name, Uint32 ArrayIndex)
{
    if (*Name == 0)
        return;

    Threading::SpinLockGuard Guard{m_Lock};
    // Remove object with the given name
    // Name will be implicitly converted to HashMapStringKey without making a copy
    m_HashTable.erase(ResMappingHashKey{Name, false, ArrayIndex});
}